

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureUnitCase::TextureUnitCase
          (TextureUnitCase *this,Context *context,char *name,char *desc,int numUnits,
          CaseType caseType,deUint32 randSeed)

{
  CaseType caseType_local;
  int numUnits_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TextureUnitCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_SELF_VALIDATE,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUnitCase_032a16c0;
  this->m_numUnitsParam = numUnits;
  this->m_caseType = caseType;
  this->m_randSeed = randSeed;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_textureTypes);
  std::
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  ::vector(&this->m_textureParams);
  std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::vector(&this->m_textures2d);
  std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::vector
            (&this->m_texturesCube);
  std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::vector
            (&this->m_textures2dArray);
  std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::vector(&this->m_textures3d);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_unitTextures);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_ndxTexType);
  this->m_shader = (MultiTexShader *)0x0;
  return;
}

Assistant:

TextureUnitCase::TextureUnitCase (Context& context, const char* name, const char* desc, int numUnits, CaseType caseType, deUint32 randSeed)
	: TestCase			(context, tcu::NODETYPE_SELF_VALIDATE, name, desc)
	, m_numUnitsParam	(numUnits)
	, m_caseType		(caseType)
	, m_randSeed		(randSeed)
	, m_shader			(DE_NULL)
{
}